

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2r2rect.cc
# Opt level: O3

S2Cap * __thiscall S2R2Rect::GetCapBound(S2Cap *__return_storage_ptr__,S2R2Rect *this)

{
  double dVar1;
  bool bVar2;
  int k;
  uint uVar3;
  double dVar4;
  double local_70;
  ostream *local_68;
  S2Point local_60;
  R2Point local_48;
  
  dVar4 = (this->rect_).bounds_[0].bounds_.c_[0];
  dVar1 = (this->rect_).bounds_[0].bounds_.c_[1];
  if (dVar4 <= dVar1) {
    local_48.c_[0] = (dVar1 + dVar4) * 0.5;
    local_48.c_[1] =
         ((this->rect_).bounds_[1].bounds_.c_[1] + (this->rect_).bounds_[1].bounds_.c_[0]) * 0.5;
    ToS2Point(&local_48);
    S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,0.0);
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
    (__return_storage_ptr__->center_).c_[0] = local_60.c_[0];
    (__return_storage_ptr__->center_).c_[1] = local_60.c_[1];
    (__return_storage_ptr__->center_).c_[2] = local_60.c_[2];
    bVar2 = S2::IsUnitLength(&__return_storage_ptr__->center_);
    if ((!bVar2) || (4.0 < (__return_storage_ptr__->radius_).length2_)) {
      S2LogMessage::S2LogMessage
                ((S2LogMessage *)&local_70,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.h"
                 ,0xf5,kFatal,(ostream *)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(local_68,"Check failed: is_valid() ",0x19);
      abort();
    }
    uVar3 = 0;
    do {
      dVar4 = util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                        ((BasicVector<Vector2,_double,_2UL> *)&this->rect_,uVar3 & 1 ^ uVar3 >> 1);
      local_68 = (ostream *)
                 util::math::internal_vector::BasicVector<Vector2,_double,_2UL>::operator[]
                           ((BasicVector<Vector2,_double,_2UL> *)((this->rect_).bounds_ + 1),
                            uVar3 >> 1);
      local_70 = dVar4;
      ToS2Point((R2Point *)&local_70);
      S2Cap::AddPoint(__return_storage_ptr__,&local_60);
      uVar3 = uVar3 + 1;
    } while (uVar3 != 4);
  }
  else {
    (__return_storage_ptr__->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Region_002bb758;
    (__return_storage_ptr__->center_).c_[0] = 1.0;
    (__return_storage_ptr__->center_).c_[1] = 0.0;
    (__return_storage_ptr__->center_).c_[2] = 0.0;
    S1ChordAngle::S1ChordAngle(&__return_storage_ptr__->radius_,-1.0);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2R2Rect::GetCapBound() const {
  if (is_empty()) return S2Cap::Empty();

  // The rectangle is a convex polygon on the sphere, since it is a subset of
  // one cube face.  Its bounding cap is also a convex region on the sphere,
  // and therefore we can bound the rectangle by just bounding its vertices.
  // We use the rectangle's center in (s,t)-space as the cap axis.  This
  // doesn't yield the minimal cap but it's pretty close.
  S2Cap cap = S2Cap::FromPoint(ToS2Point(GetCenter()));
  for (int k = 0; k < 4; ++k) {
    cap.AddPoint(ToS2Point(GetVertex(k)));
  }
  return cap;
}